

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostViolation
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  undefined8 in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  VarStatus colStatus;
  int c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *redcost;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffc08;
  int n;
  uint5 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc15;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  type_conflict5 local_3d9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc30;
  undefined1 local_380 [64];
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcc8;
  undefined1 local_330 [80];
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [80];
  undefined1 local_278 [80];
  undefined1 local_228 [80];
  undefined8 local_1d8;
  VarStatus local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  undefined8 local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  bool local_191;
  undefined1 *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    _syncRealSolution((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_fffffffffffffc17,
                                  CONCAT16(in_stack_fffffffffffffc16,
                                           CONCAT15(in_stack_fffffffffffffc15,
                                                    in_stack_fffffffffffffc10))));
    local_1b8 = &(in_RDI->_solReal)._redCost;
    local_1c0 = 0;
    local_130 = local_1a8;
    local_138 = &local_1c0;
    local_128 = local_138;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffcc8,
               (double)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_1c8 = 0;
    local_148 = local_1b0;
    local_150 = &local_1c8;
    local_140 = local_150;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffcc8,
               (double)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_1cc = numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x6175e7);
    while (local_1cc = local_1cc + -1, -1 < local_1cc) {
      local_1d0 = basisColStatus(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
      iVar3 = intParam(in_RDI,OBJSENSE);
      n = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
      if (iVar3 == -1) {
        local_3d9 = false;
        if ((local_1d0 != ON_UPPER) && (local_3d9 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),n);
          local_1d8 = 0;
          local_3d9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffffc08,(double *)0x61767c);
        }
        if (local_3d9 != false) {
          local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffc17,
                                              CONCAT16(in_stack_fffffffffffffc16,
                                                       CONCAT15(in_stack_fffffffffffffc15,
                                                                in_stack_fffffffffffffc10))),
                                  (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_20 = local_228;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = local_228;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )),in_stack_fffffffffffffc08);
          local_8 = local_228;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffc30,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_50 = local_278;
          local_58 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_59,local_1a8);
          local_40 = local_278;
          local_48 = local_58;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )),in_stack_fffffffffffffc08);
          local_38 = local_278;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc08,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6177e7);
          if (tVar2) {
            local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffffc17,
                                                CONCAT16(in_stack_fffffffffffffc16,
                                                         CONCAT15(in_stack_fffffffffffffc15,
                                                                  in_stack_fffffffffffffc10))),
                                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            local_80 = local_2c8;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_89,local_88);
            local_70 = local_2c8;
            local_78 = local_88;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
            local_68 = local_2c8;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))));
            local_178 = local_1a8;
            local_180 = local_2c8;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
          }
        }
        in_stack_fffffffffffffc17 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffc17 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(ulong)CONCAT16(in_stack_fffffffffffffc16,
                                          CONCAT15(in_stack_fffffffffffffc15,
                                                   in_stack_fffffffffffffc10)),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_2d0 = 0;
          in_stack_fffffffffffffc17 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc08,(double *)0x61790a);
        }
        if ((type_conflict5)in_stack_fffffffffffffc17 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffc30,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc08,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x617963);
          if (tVar2) {
            local_160 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffc17,
                                                 CONCAT16(in_stack_fffffffffffffc16,
                                                          CONCAT15(in_stack_fffffffffffffc15,
                                                                   in_stack_fffffffffffffc10))),
                                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            local_158 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
          }
        }
      }
      else {
        in_stack_fffffffffffffc16 = false;
        if ((local_1d0 != ON_UPPER) && (in_stack_fffffffffffffc16 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   (uint7)CONCAT15(in_stack_fffffffffffffc15,
                                                   in_stack_fffffffffffffc10)),n);
          local_2d8 = 0;
          in_stack_fffffffffffffc16 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc08,(double *)0x617a01);
        }
        if ((type_conflict5)in_stack_fffffffffffffc16 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffc30,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            CONCAT15(in_stack_fffffffffffffc15,
                                                     in_stack_fffffffffffffc10))),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc08,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x617a5a);
          if (tVar2) {
            local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffc17,
                                                 CONCAT16(in_stack_fffffffffffffc16,
                                                          CONCAT15(in_stack_fffffffffffffc15,
                                                                   in_stack_fffffffffffffc10))),
                                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            local_168 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
          }
        }
        in_stack_fffffffffffffc15 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffc15 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffc17,
                                   CONCAT16(in_stack_fffffffffffffc16,
                                            (uint6)in_stack_fffffffffffffc10)),
                       (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_2e0 = 0;
          in_stack_fffffffffffffc15 =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc08,(double *)0x617af3);
        }
        if ((type_conflict5)in_stack_fffffffffffffc15 != false) {
          local_b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffc17,
                                              CONCAT16(in_stack_fffffffffffffc16,
                                                       CONCAT15(in_stack_fffffffffffffc15,
                                                                in_stack_fffffffffffffc10))),
                                  (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_b0 = local_330;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b9,local_b8);
          local_a0 = local_330;
          local_a8 = local_b8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )),in_stack_fffffffffffffc08);
          iVar3 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
          local_98 = local_330;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffc30,(self_type *)in_RDI);
          in_stack_fffffffffffffc08 =
               &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT17(in_stack_fffffffffffffc17,
                                         CONCAT16(in_stack_fffffffffffffc16,
                                                  CONCAT15(in_stack_fffffffffffffc15,
                                                           in_stack_fffffffffffffc10))),iVar3)->
                m_backend;
          local_e0 = local_380;
          local_e8 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_e9,local_1a8);
          local_d0 = local_380;
          local_d8 = local_e8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )),in_stack_fffffffffffffc08);
          local_c8 = local_380;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffc17,
                              CONCAT16(in_stack_fffffffffffffc16,
                                       CONCAT15(in_stack_fffffffffffffc15,in_stack_fffffffffffffc10)
                                      )));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc08,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x617c50);
          if (tVar2) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffc17,
                                                 CONCAT16(in_stack_fffffffffffffc16,
                                                          CONCAT15(in_stack_fffffffffffffc15,
                                                                   in_stack_fffffffffffffc10))),
                                     (int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
            local_110 = &stack0xfffffffffffffc30;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_119,local_118);
            local_100 = &stack0xfffffffffffffc30;
            local_108 = local_118;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
            local_f8 = &stack0xfffffffffffffc30;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))));
            local_188 = local_1a8;
            local_190 = &stack0xfffffffffffffc30;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffc17,
                                CONCAT16(in_stack_fffffffffffffc16,
                                         CONCAT15(in_stack_fffffffffffffc15,
                                                  in_stack_fffffffffffffc10))),
                       in_stack_fffffffffffffc08);
          }
        }
      }
    }
    local_191 = true;
  }
  else {
    local_191 = false;
  }
  return local_191;
}

Assistant:

bool SoPlexBase<R>::getRedCostViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& redcost = _solReal._redCost;
   assert(redcost.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int c = numCols() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus colStatus = basisColStatus(c);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }
      }
      else
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }
      }
   }

   return true;
}